

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

void cram_byte_array_len_decode_free(cram_codec *c)

{
  cram_codec *pcVar1;
  
  if (c != (cram_codec *)0x0) {
    pcVar1 = (c->field_6).byte_array_len.len_codec;
    if (pcVar1 != (cram_codec *)0x0) {
      (*pcVar1->free)(pcVar1);
    }
    pcVar1 = (c->field_6).byte_array_len.value_codec;
    if (pcVar1 != (cram_codec *)0x0) {
      (*pcVar1->free)(pcVar1);
    }
    free(c);
    return;
  }
  return;
}

Assistant:

void cram_byte_array_len_decode_free(cram_codec *c) {
    if (!c) return;

    if (c->byte_array_len.len_codec)
	c->byte_array_len.len_codec->free(c->byte_array_len.len_codec);

    if (c->byte_array_len.value_codec)
	c->byte_array_len.value_codec->free(c->byte_array_len.value_codec);

    free(c);
}